

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

string * __thiscall
Lodtalk::AST::MethodHeader::getSelector_abi_cxx11_
          (string *__return_storage_ptr__,MethodHeader *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->selector);
  return __return_storage_ptr__;
}

Assistant:

const std::string MethodHeader::getSelector() const
{
	return selector;
}